

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void shared_ptr_test(void)

{
  shared_ptr_base sVar1;
  Xxx *pXVar2;
  ostream *poVar3;
  long in_FS_OFFSET;
  vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_> PtrVec;
  shared_ptr<Xxx> local_48;
  shared_ptr<Xxx> yPtr;
  value_type local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.super_shared_ptr_base.pn.pn = (shared_ptr_count)(long *)0x0;
  local_28.px = (Xxx *)0x0;
  std::operator<<((ostream *)&std::cout,"shared_ptr_test: in\n");
  if ((local_28.super_shared_ptr_base.pn.pn == (long *)0x0) ||
     (*(long *)local_28.super_shared_ptr_base.pn.pn < 1)) {
    pXVar2 = (Xxx *)operator_new(0x10);
    Xxx::Xxx(pXVar2,0x400);
    shared_ptr<Xxx>::shared_ptr(&yPtr,pXVar2);
    poVar3 = std::operator<<((ostream *)&std::cout,"yPtr=");
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    if ((yPtr.super_shared_ptr_base.pn.pn != (long *)0x0) &&
       (0 < *(long *)yPtr.super_shared_ptr_base.pn.pn)) {
      pXVar2 = shared_ptr<Xxx>::operator->(&yPtr);
      Xxx::doSomething(pXVar2);
      shared_ptr<Xxx>::shared_ptr(&local_48,&yPtr);
      pXVar2 = local_28.px;
      sVar1.pn.pn = local_28.super_shared_ptr_base.pn.pn;
      local_28.super_shared_ptr_base.pn.pn = local_48.super_shared_ptr_base.pn.pn;
      local_28.px = local_48.px;
      local_48.super_shared_ptr_base.pn.pn = sVar1.pn.pn;
      local_48.px = pXVar2;
      shared_ptr<Xxx>::release(&local_48);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"yPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      PtrVec.super__Vector_base<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      PtrVec.super__Vector_base<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      PtrVec.super__Vector_base<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::push_back(&PtrVec,&local_28);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::~vector(&PtrVec);
      shared_ptr<Xxx>::release(&yPtr);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      PtrVec.super__Vector_base<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      PtrVec.super__Vector_base<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      PtrVec.super__Vector_base<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::push_back(&PtrVec,&local_28);
      poVar3 = std::operator<<((ostream *)&std::cout,"PtrList.back=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::vector<shared_ptr<Xxx>,_std::allocator<shared_ptr<Xxx>_>_>::~vector(&PtrVec);
      poVar3 = std::operator<<((ostream *)&std::cout,"xPtr=");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::operator<<((ostream *)&std::cout,"shared_ptr_test: out\n");
      shared_ptr<Xxx>::release(&local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return;
      }
      __stack_chk_fail();
    }
  }
  abort();
}

Assistant:

void shared_ptr_test(void)
{
    // Create an empty (ie. NULL) shared_ptr
    shared_ptr<Xxx> xPtr;

    std::cout << "shared_ptr_test: in\n";

    if (xPtr) // empty pointer
    {
        abort(); // impossible
    }
    else
    {
        // Create a new Xxx object, and give its ownership to the yPtr shared_ptr
        shared_ptr<Xxx> yPtr(new Xxx(1024));
        // Same as :
        //shared_ptr<Xxx> yPtr;
        //yPtr.reset(new Xxx(1024));

        std::cout << "yPtr=" << yPtr.get() << std::endl;
        if (yPtr) // valid pointer
        {
            // Access members functions/variables like with a raw pointer
            yPtr->doSomething();
        }
        else
        {
            abort(); // impossible
        }

        // Share ownership by making a copy of the shared_ptr (the reference counter reaches 2)
        xPtr = yPtr;
        std::cout << "xPtr=" << xPtr.get() << std::endl;
        std::cout << "yPtr=" << yPtr.get() << std::endl;

        std::vector<shared_ptr<Xxx> > PtrVec;
        PtrVec.push_back(xPtr);
        std::cout << "xPtr=" << xPtr.get() << std::endl;

    } // yPtr is destroyed, but xPtr retains the ownership of the object

    std::cout << "xPtr=" << xPtr.get() << std::endl;

    {
        std::vector<shared_ptr<Xxx> > PtrList;
        PtrList.push_back(xPtr);

        std::cout << "PtrList.back=" << PtrList.back().get() << std::endl;
        std::cout << "xPtr=" << xPtr.get() << std::endl;
    }

    std::cout << "xPtr=" << xPtr.get() << std::endl;

    std::cout << "shared_ptr_test: out\n";

    // Same as :
    //xPtr.reset();
}